

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void __thiscall
ImStb::stb_textedit_find_charpos
          (ImStb *this,StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int line_start_idx;
  int iVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  ImWchar *local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  fVar5 = SUB84(str,0);
  fVar9 = find->y;
  if (fVar9 == fVar5) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar6 = 0;
      iVar4 = 0;
      if ((int)fVar5 < 1) {
        iVar7 = 0;
      }
      else {
        do {
          iVar7 = iVar4;
          local_38 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar7 * 2);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_38,
                     (ImVec2 *)0x1,SUB41(single_line,0));
          iVar6 = iVar7 + (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
          iVar4 = iVar6;
        } while (iVar6 < (int)fVar5);
      }
      *(int *)(this + 0xc) = iVar6;
      *(undefined4 *)(this + 0x10) = 0;
      *(int *)(this + 0x14) = iVar7;
    }
    else {
      auVar10._0_8_ =
           InputTextCalcTextSizeW
                     (*(ImWchar **)(find + 1),*(ImWchar **)(find + 1) + (int)fVar5,&local_38,
                      (ImVec2 *)0x1,SUB41(single_line,0));
      auVar10._8_56_ = extraout_var;
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(float *)(this + 0x10) = fVar5;
      uVar2 = vextractps_avx(auVar10._0_16_,1);
      *(undefined4 *)(this + 8) = uVar2;
      *(float *)this = auVar10._0_4_;
    }
  }
  else {
    fVar8 = 0.0;
    iVar4 = 0;
    iVar6 = 0;
    while( true ) {
      line_start_idx = iVar4;
      *(float *)(this + 4) = fVar8;
      local_38 = (ImWchar *)0x0;
      pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)line_start_idx * 2);
      auVar11._0_8_ =
           InputTextCalcTextSizeW
                     (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)fVar9 * 2),&local_38,
                      (ImVec2 *)0x1,SUB41(single_line,0));
      auVar11._8_56_ = extraout_var_00;
      auVar3 = vmovshdup_avx(auVar11._0_16_);
      iVar7 = (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
      iVar4 = line_start_idx + iVar7;
      if ((int)fVar5 < iVar4) break;
      fVar8 = auVar3._0_4_ + *(float *)(this + 4);
      fVar9 = find->y;
      iVar6 = line_start_idx;
    }
    *(int *)(this + 0xc) = line_start_idx;
    *(int *)(this + 0x10) = iVar7;
    *(float *)(this + 8) = auVar3._0_4_;
    *(int *)(this + 0x14) = iVar6;
    *(undefined4 *)this = 0;
    if (line_start_idx < (int)fVar5) {
      iVar4 = 0;
      do {
        fVar9 = STB_TEXTEDIT_GETWIDTH((ImGuiInputTextState *)find,line_start_idx,iVar4);
        *(float *)this = fVar9 + *(float *)this;
        iVar4 = iVar4 + 1;
      } while ((int)fVar5 - line_start_idx != iVar4);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}